

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS
ref_interp_scalar(REF_INTERP ref_interp,REF_INT leading_dim,REF_DBL *from_scalar,REF_DBL *to_scalar)

{
  REF_NODE ref_node;
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  REF_STATUS RVar8;
  long lVar9;
  ulong uVar10;
  REF_MPI ref_mpi;
  char *pcVar11;
  ulong uVar12;
  size_t __size;
  long lVar13;
  double dVar14;
  REF_INT n_recept;
  uint local_118;
  REF_INT n_donor;
  REF_MPI local_110;
  void *local_108;
  REF_INT *local_100;
  REF_INT *recept_node;
  REF_DBL *local_f0;
  void *local_e8;
  void *local_e0;
  REF_INT *donor_ret;
  REF_CELL local_d0;
  REF_INT *donor_cell;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_scalar;
  REF_INT nodes [27];
  
  ref_node = ref_interp->to_grid->node;
  n_recept = 0;
  if (0 < (long)ref_node->max) {
    iVar4 = 0;
    lVar9 = 0;
    do {
      if ((-1 < ref_node->global[lVar9]) && (ref_node->ref_mpi->id == ref_node->part[lVar9])) {
        iVar4 = iVar4 + 1;
        n_recept = iVar4;
      }
      lVar9 = lVar9 + 1;
    } while (ref_node->max != lVar9);
  }
  lVar9 = (long)n_recept;
  if (lVar9 < 0) {
    pcVar11 = "malloc recept_bary of REF_DBL negative";
    uVar7 = 0x81e;
LAB_00189e42:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar7,
           "ref_interp_scalar",pcVar11);
    RVar8 = 1;
  }
  else {
    local_110 = ref_interp->to_grid->mpi;
    local_d0 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
    pvVar3 = malloc((ulong)(uint)(n_recept * 4) << 3);
    if (pvVar3 == (void *)0x0) {
      pcVar11 = "malloc recept_bary of REF_DBL NULL";
      uVar7 = 0x81e;
    }
    else {
      __size = lVar9 << 2;
      local_e0 = pvVar3;
      local_108 = malloc(__size);
      if (local_108 == (void *)0x0) {
        pcVar11 = "malloc recept_cell of REF_INT NULL";
        uVar7 = 0x81f;
      }
      else {
        recept_node = (REF_INT *)malloc(__size);
        if (recept_node == (REF_INT *)0x0) {
          pcVar11 = "malloc recept_node of REF_INT NULL";
          uVar7 = 0x820;
        }
        else {
          local_e8 = malloc(__size);
          if (local_e8 == (void *)0x0) {
            pcVar11 = "malloc recept_ret of REF_INT NULL";
            uVar7 = 0x821;
          }
          else {
            local_100 = (REF_INT *)malloc(__size);
            if (local_100 == (REF_INT *)0x0) {
              pcVar11 = "malloc recept_proc of REF_INT NULL";
              uVar7 = 0x822;
            }
            else {
              n_recept = 0;
              ref_mpi = local_110;
              local_118 = leading_dim;
              local_f0 = to_scalar;
              if (0 < ref_node->max) {
                lVar13 = 0;
                lVar9 = 0;
                do {
                  if ((-1 < ref_node->global[lVar9]) &&
                     (ref_node->ref_mpi->id == ref_node->part[lVar9])) {
                    if (ref_interp->cell[lVar9] == -1) {
                      pcVar11 = "node needs to be localized";
                      uVar7 = 0x827;
                      goto LAB_00189e42;
                    }
                    uVar1 = ref_node_clip_bary4((REF_DBL *)((long)ref_interp->bary + lVar13),
                                                (REF_DBL *)((long)n_recept * 0x20 + (long)local_e0))
                    ;
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x82a,"ref_interp_scalar",(ulong)uVar1,"clip");
                      return uVar1;
                    }
                    lVar5 = (long)n_recept;
                    local_100[lVar5] = ref_interp->part[lVar9];
                    *(REF_INT *)((long)local_108 + lVar5 * 4) = ref_interp->cell[lVar9];
                    recept_node[lVar5] = (REF_INT)lVar9;
                    *(REF_INT *)((long)local_e8 + (long)n_recept * 4) = local_110->id;
                    n_recept = n_recept + 1;
                    ref_mpi = local_110;
                  }
                  lVar9 = lVar9 + 1;
                  lVar13 = lVar13 + 0x20;
                } while (lVar9 < ref_node->max);
              }
              uVar2 = ref_mpi_blindsend(ref_mpi,local_100,local_108,1,n_recept,&donor_cell,&n_donor,
                                        1);
              uVar1 = local_118;
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x835,"ref_interp_scalar",(ulong)uVar2,"blind send cell");
                return uVar2;
              }
              uVar2 = ref_mpi_blindsend(local_110,local_100,local_e8,1,n_recept,&donor_ret,&n_donor,
                                        1);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x838,"ref_interp_scalar",(ulong)uVar2,"blind send ret");
                return uVar2;
              }
              uVar2 = ref_mpi_blindsend(local_110,local_100,recept_node,1,n_recept,&donor_node,
                                        &n_donor,1);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x83b,"ref_interp_scalar",(ulong)uVar2,"blind send node");
                return uVar2;
              }
              uVar2 = ref_mpi_blindsend(local_110,local_100,local_e0,4,n_recept,&donor_bary,&n_donor
                                        ,3);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x83e,"ref_interp_scalar",(ulong)uVar2);
                return uVar2;
              }
              free(local_100);
              free(local_e8);
              if (recept_node != (REF_INT *)0x0) {
                free(recept_node);
              }
              free(local_108);
              free(local_e0);
              if ((int)(n_donor * uVar1) < 0) {
                pcVar11 = "malloc donor_scalar of REF_DBL negative";
                uVar7 = 0x846;
                goto LAB_00189e42;
              }
              local_108 = malloc((ulong)(n_donor * uVar1) << 3);
              if (local_108 != (void *)0x0) {
                if (0 < n_donor) {
                  lVar9 = 0;
                  do {
                    uVar2 = ref_cell_nodes(local_d0,donor_cell[lVar9],nodes);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x84a,"ref_interp_scalar",(ulong)uVar2);
                      return uVar2;
                    }
                    if (0 < (int)uVar1) {
                      lVar13 = lVar9 * (ulong)uVar1;
                      uVar2 = local_d0->node_per;
                      uVar10 = 0;
                      do {
                        *(undefined8 *)((long)local_108 + uVar10 * 8 + lVar13 * 8) = 0;
                        if (0 < (int)uVar2) {
                          dVar14 = *(double *)((long)local_108 + uVar10 * 8 + lVar13 * 8);
                          uVar12 = 0;
                          do {
                            dVar14 = dVar14 + donor_bary
                                              [(ulong)((uint)lVar9 & 0x3fffffff) * 4 + uVar12] *
                                              from_scalar
                                              [(int)(nodes[uVar12] * uVar1 + (int)uVar10)];
                            *(double *)((long)local_108 + uVar10 * 8 + lVar13 * 8) = dVar14;
                            uVar12 = uVar12 + 1;
                          } while (uVar2 != uVar12);
                        }
                        uVar10 = uVar10 + 1;
                      } while (uVar10 != uVar1);
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < n_donor);
                }
                if (donor_cell != (REF_INT *)0x0) {
                  free(donor_cell);
                }
                if (donor_bary != (REF_DBL *)0x0) {
                  free(donor_bary);
                }
                uVar1 = ref_mpi_blindsend(local_110,donor_ret,local_108,uVar1,n_donor,&recept_scalar
                                          ,&n_recept,3);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x866,"ref_interp_scalar",(ulong)uVar1,"blind send bary");
                  return uVar1;
                }
                uVar1 = ref_mpi_blindsend(local_110,donor_ret,donor_node,1,n_donor,&recept_node,
                                          &n_recept,1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x869,"ref_interp_scalar",(ulong)uVar1,"blind send node");
                  return uVar1;
                }
                free(local_108);
                if (donor_node != (REF_INT *)0x0) {
                  free(donor_node);
                }
                if (donor_ret != (REF_INT *)0x0) {
                  free(donor_ret);
                }
                if (0 < (long)n_recept) {
                  lVar9 = 0;
                  pRVar6 = recept_scalar;
                  do {
                    if (0 < (int)local_118) {
                      iVar4 = recept_node[lVar9];
                      uVar10 = 0;
                      do {
                        if (0x7fefffffffffffff < (ulong)ABS(pRVar6[uVar10])) {
                          pcVar11 = "recept_scalar";
                          uVar7 = 0x872;
                          goto LAB_00189e42;
                        }
                        local_f0[(long)(int)(iVar4 * local_118) + uVar10] = pRVar6[uVar10];
                        uVar10 = uVar10 + 1;
                      } while (local_118 != uVar10);
                    }
                    lVar9 = lVar9 + 1;
                    pRVar6 = pRVar6 + (int)local_118;
                  } while (lVar9 != n_recept);
                }
                if (recept_node != (REF_INT *)0x0) {
                  free(recept_node);
                }
                if (recept_scalar != (REF_DBL *)0x0) {
                  free(recept_scalar);
                }
                uVar1 = ref_node_ghost_dbl(ref_node,local_f0,local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x882,"ref_interp_scalar",(ulong)uVar1,"ghost");
                  return uVar1;
                }
                if ((long)ref_node->max < 1) {
                  return 0;
                }
                lVar9 = 0;
                do {
                  if (-1 < ref_node->global[lVar9] && 0 < (int)local_118) {
                    uVar10 = 0;
                    do {
                      if (0x7fefffffffffffff < (ulong)ABS(local_f0[uVar10])) {
                        pcVar11 = "to_scalar ghost";
                        uVar7 = 0x885;
                        goto LAB_00189e42;
                      }
                      uVar10 = uVar10 + 1;
                    } while (local_118 != uVar10);
                  }
                  lVar9 = lVar9 + 1;
                  local_f0 = local_f0 + local_118;
                  if (lVar9 == ref_node->max) {
                    return 0;
                  }
                } while( true );
              }
              pcVar11 = "malloc donor_scalar of REF_DBL NULL";
              uVar7 = 0x846;
              local_108 = (void *)0x0;
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar7,
           "ref_interp_scalar",pcVar11);
    RVar8 = 2;
  }
  return RVar8;
}

Assistant:

REF_FCN REF_STATUS ref_interp_scalar(REF_INTERP ref_interp, REF_INT leading_dim,
                                     REF_DBL *from_scalar, REF_DBL *to_scalar) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_MPI ref_mpi = ref_grid_mpi(to_grid);
  REF_CELL from_cell;
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_scalar, *donor_scalar, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_scalar, leading_dim * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (im = 0; im < leading_dim; im++) {
      donor_scalar[im + leading_dim * donation] = 0.0;
      for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
        donor_scalar[im + leading_dim * donation] +=
            donor_bary[ibary + 4 * donation] *
            from_scalar[im + leading_dim * nodes[ibary]];
      }
      /*
      RAB(isfinite(donor_scalar[im + leading_dim * donation]), "donor_scalar", {
        printf("%.20e\n", donor_scalar[im + leading_dim * donation]);
        for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
          printf("%.20e %.20e %.20e\n",
                 donor_bary[ibary + 4 * donation] *
                     from_scalar[im + leading_dim * nodes[ibary]],
                 donor_bary[ibary + 4 * donation],
                 from_scalar[im + leading_dim * nodes[ibary]]);
        }
      });
      */
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_scalar, leading_dim,
                        n_donor, (void **)(&recept_scalar), &n_recept,
                        REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_scalar);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(recept_scalar[im + leading_dim * receptor]),
          "recept_scalar");
      to_scalar[im + leading_dim * node] =
          recept_scalar[im + leading_dim * receptor];
    }
  }

  ref_free(recept_node);
  ref_free(recept_scalar);

  /*
  each_ref_node_valid_node(to_node, node) {
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(to_scalar[im + leading_dim * node]), "to_scalar local");
    }
  }
  */
  RSS(ref_node_ghost_dbl(to_node, to_scalar, leading_dim), "ghost");
  each_ref_node_valid_node(to_node, node) {
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(to_scalar[im + leading_dim * node]), "to_scalar ghost");
    }
  }

  return REF_SUCCESS;
}